

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array.cpp
# Opt level: O0

void __thiscall Omega_h::Read<long>::Read(Read<long> *this,LO size_in,long value,string *name_in)

{
  Write<long> local_38;
  string *local_28;
  string *name_in_local;
  long value_local;
  Read<long> *pRStack_10;
  LO size_in_local;
  Read<signed_char> *this_local;
  
  local_28 = name_in;
  name_in_local = (string *)value;
  value_local._4_4_ = size_in;
  pRStack_10 = this;
  Write<long>::Write(&local_38,size_in,value,name_in);
  Read(this,&local_38);
  Write<long>::~Write(&local_38);
  return;
}

Assistant:

Read<T>::Read(LO size_in, T value, std::string const& name_in)
    : Read<T>(Write<T>(size_in, value, name_in)) {}